

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

IssuanceParameter *
cfd::core::ConfidentialTransaction::CalculateIssuanceValue
          (IssuanceParameter *__return_storage_ptr__,Txid *txid,uint32_t vout,bool is_blind,
          ByteData256 *contract_hash,ByteData256 *asset_entropy)

{
  ByteData256 *this;
  ConfidentialAssetId *this_00;
  ByteData *this_01;
  bool bVar1;
  undefined7 in_register_00000009;
  ConfidentialAssetId asset;
  BlindFactor entropy;
  ConfidentialAssetId token;
  bool local_119;
  ByteData *local_118;
  undefined1 local_110 [40];
  undefined4 local_e8;
  uint32_t local_e4;
  ByteData *local_e0;
  Txid *local_d8;
  undefined1 local_d0 [80];
  undefined4 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  local_e8 = (undefined4)CONCAT71(in_register_00000009,is_blind);
  (__return_storage_ptr__->entropy)._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
  this = &(__return_storage_ptr__->entropy).data_;
  local_119 = is_blind;
  local_e4 = vout;
  local_d8 = txid;
  ByteData256::ByteData256(this);
  (__return_storage_ptr__->asset)._vptr_ConfidentialAssetId =
       (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  local_118 = &(__return_storage_ptr__->asset).data_;
  ByteData::ByteData(local_118);
  this_00 = &__return_storage_ptr__->asset;
  (__return_storage_ptr__->asset).version_ = '\0';
  (__return_storage_ptr__->token)._vptr_ConfidentialAssetId =
       (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  this_01 = &(__return_storage_ptr__->token).data_;
  ByteData::ByteData(this_01);
  (__return_storage_ptr__->token).version_ = '\0';
  local_e0 = this_01;
  bVar1 = ByteData256::Equals(asset_entropy,(ByteData256 *)kEmptyByteData256);
  if (bVar1) {
    CalculateAssetEntropy((BlindFactor *)local_d0,local_d8,local_e4,contract_hash);
    if ((IssuanceParameter *)local_d0 != __return_storage_ptr__) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_d0 + 8));
    }
    CalculateAsset((ConfidentialAssetId *)local_110,(BlindFactor *)local_d0);
    if (this_00 != (ConfidentialAssetId *)local_110) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_118->data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_110 + 8));
      (__return_storage_ptr__->asset).version_ = local_110[0x20];
    }
    CalculateReissuanceToken
              ((ConfidentialAssetId *)(local_d0 + 0x20),(BlindFactor *)local_d0,local_e8._0_1_);
    if (&__return_storage_ptr__->token != (ConfidentialAssetId *)(local_d0 + 0x20)) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_e0->data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_d0 + 0x28));
      (__return_storage_ptr__->token).version_ = local_d0[0x40];
    }
    local_d0._72_8_ = "cfdcore_elements_transaction.cpp";
    local_80 = 0x864;
    local_78 = "CalculateIssuanceValue";
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_50,this_00);
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_70,&__return_storage_ptr__->token);
    logger::log<std::__cxx11::string&,std::__cxx11::string&,bool&>
              ((CfdSourceLocation *)(local_d0 + 0x48),kCfdLogLevelInfo,
               "asset[{}] token[{}] is_blind[{}]",&local_50,&local_70,&local_119);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_d0._32_8_ = &PTR__ConfidentialAssetId_0068d228;
    if ((pointer)local_d0._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_d0._40_8_);
    }
    local_110._0_8_ = &PTR__ConfidentialAssetId_0068d228;
    if ((_func_int **)local_110._8_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_110._8_8_);
    }
    local_d0._0_8_ = &PTR__BlindFactor_0068d500;
  }
  else {
    local_110._0_8_ = &PTR__BlindFactor_0068d500;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_110 + 8),
               &contract_hash->data_);
    if ((IssuanceParameter *)local_110 != __return_storage_ptr__) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_110 + 8));
    }
    local_110._0_8_ = &PTR__BlindFactor_0068d500;
    if ((_func_int **)local_110._8_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_110._8_8_);
    }
    CalculateAsset((ConfidentialAssetId *)local_110,&__return_storage_ptr__->entropy);
    if (this_00 != (ConfidentialAssetId *)local_110) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_118->data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_110 + 8));
      (__return_storage_ptr__->asset).version_ = local_110[0x20];
    }
    local_110._0_8_ = &PTR__ConfidentialAssetId_0068d228;
    local_d0._8_8_ = local_110._8_8_;
  }
  if ((_func_int **)local_d0._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_d0._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::CalculateIssuanceValue(
    const Txid &txid, uint32_t vout, bool is_blind,
    const ByteData256 &contract_hash, const ByteData256 &asset_entropy) {
  IssuanceParameter result;

  if (!asset_entropy.Equals(kEmptyByteData256)) {
    // reissue
    result.entropy = BlindFactor(contract_hash);
    result.asset = CalculateAsset(
        result.entropy);  // ConfidentialAssetId(ByteData(asset));
    return result;
  }

  // calculate issue value
  const BlindFactor entropy = CalculateAssetEntropy(txid, vout, contract_hash);
  result.entropy = entropy;

  // calculate asset value
  const ConfidentialAssetId asset = CalculateAsset(entropy);
  result.asset = asset;

  // calculate token
  const ConfidentialAssetId token =
      CalculateReissuanceToken(entropy, is_blind);
  result.token = token;

  info(
      CFD_LOG_SOURCE, "asset[{}] token[{}] is_blind[{}]",
      result.asset.GetHex(), result.token.GetHex(), is_blind);
  return result;
}